

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

bool __thiscall
iutest::detail::FieldMatcher<int_test::syntax_tests::X::*,_int>::Check<test::syntax_tests::X>
          (FieldMatcher<int_test::syntax_tests::X::*,_int> *this,X *actual,type **param_2)

{
  bool bVar1;
  EqMatcher<int> local_58;
  AssertionResult local_48;
  type **local_20;
  type **param_2_local;
  X *actual_local;
  FieldMatcher<int_test::syntax_tests::X::*,_int> *this_local;
  
  local_20 = param_2;
  param_2_local = (type **)actual;
  actual_local = (X *)this;
  CastToMatcher<int>((int *)&local_58,(type **)&this->m_expected);
  EqMatcher<int>::operator()(&local_48,&local_58,(int *)((long)param_2_local + *this->m_field));
  bVar1 = AssertionResult::operator_cast_to_bool(&local_48);
  AssertionResult::~AssertionResult(&local_48);
  EqMatcher<int>::~EqMatcher(&local_58);
  return bVar1;
}

Assistant:

bool Check(const U& actual
        , typename detail::disable_if_t< detail::is_pointer<U> >::type*& = detail::enabler::value)
    {
        return static_cast<bool>(CastToMatcher(m_expected)(actual.*m_field));
    }